

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::clear(QComboBox *this)

{
  long lVar1;
  long *plVar2;
  undefined4 uVar3;
  QPersistentModelIndex *this_00;
  long in_FS_OFFSET;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QVariant local_98;
  QModelIndex local_78;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data aStack_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar2 = *(long **)(lVar1 + 0x298);
  this_00 = (QPersistentModelIndex *)(lVar1 + 0x2c0);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
  uVar3 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_78);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
  (**(code **)(*plVar2 + 0x108))(plVar2,0,uVar3,(QModelIndex *)&local_98);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStack_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8 = (QArrayData *)0x0;
  uStack_b0 = 0;
  local_a8 = 0;
  ::QVariant::QVariant(&local_98,(QString *)&local_b8);
  local_78.i._0_4_ = 0x80c1;
  local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0xffffffff);
  local_78._0_8_ = QTextDocument::setMarkdown;
  local_78.m.ptr = (QAbstractItemModel *)this;
  ::QVariant::QVariant((QVariant *)&aStack_58,&local_98);
  local_78.i = CONCAT44(local_78.i._4_4_,0x800e);
  ::QVariant::~QVariant(&local_98);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,0x10);
    }
  }
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::clear()
{
    Q_D(QComboBox);
    d->model->removeRows(0, d->model->rowCount(d->root), d->root);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, QString());
    QAccessible::updateAccessibility(&event);
#endif
}